

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::process(Population *this)

{
  pointer pCVar1;
  long lVar2;
  Chromosome *chromo;
  pointer pCVar3;
  undefined1 auVar4 [16];
  double local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>_>
  local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>_>
  local_20;
  
  pCVar3 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_30 = 0.0;
  for (; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    Chromosome::process(pCVar3);
    local_30 = local_30 + pCVar3->fitness;
  }
  local_20.current._M_current =
       (__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>)
       (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28.current._M_current =
       (__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>)
       (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::
  sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>>
            (&local_20,&local_28);
  pCVar3 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->minFitness = pCVar1[-1].fitness;
  this->maxFitness = pCVar3->fitness;
  lVar2 = ((long)pCVar1 - (long)pCVar3) / 0x60;
  auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  this->averageFitness =
       local_30 /
       ((auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
  return;
}

Assistant:

void Population::process() {

    double totalFitness = 0;
    // re-calculate changed chromosomes
    for (Chromosome& chromo : chromosomes){
        chromo.process();
        totalFitness += chromo.getFitness();
    }
    // sort list by fitness
    std::sort(chromosomes.rbegin(), chromosomes.rend());
    // calculate min/max fitness of population

    minFitness = chromosomes.back().getFitness();
    maxFitness = chromosomes.front().getFitness();
    averageFitness = totalFitness/chromosomes.size();
}